

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O2

bool cppwinrt::is_add_overload(MethodDef *method)

{
  bool bVar1;
  string_view local_28;
  string_view local_18;
  
  bVar1 = winmd::reader::MethodDef::SpecialName(method);
  if (bVar1) {
    local_18 = winmd::reader::MethodDef::Name(method);
    local_28._M_len = 4;
    local_28._M_str = "add_";
    bVar1 = starts_with(&local_18,&local_28);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool is_add_overload(MethodDef const& method)
    {
        return method.SpecialName() && starts_with(method.Name(), "add_");
    }